

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

mat4 * __thiscall lumeview::Camera::view_matrix(mat4 *__return_storage_ptr__,Camera *this)

{
  tvec3<float,_(glm::precision)0> *in_R8;
  vec3 vVar1;
  undefined8 local_70;
  float local_68;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_5c;
  undefined1 local_50 [16];
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_40;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_30;
  undefined8 local_20;
  undefined4 local_18;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  local_30.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )from(this);
  local_18 = local_30._8_4_;
  local_20 = local_30._0_8_;
  local_50._0_12_ = (undefined1  [12])to(this);
  local_40.field_0.z = (float)local_50._8_4_;
  local_40._0_8_ = local_50._0_8_;
  vVar1 = up(this);
  local_70 = vVar1.field_0._0_8_;
  local_5c._0_8_ = local_70;
  local_68 = vVar1.field_0._8_4_;
  local_5c.field_0.z = local_68;
  glm::lookAt<float,(glm::precision)0>
            (__return_storage_ptr__,(glm *)&local_20,
             (tvec3<float,_(glm::precision)0> *)&local_40.field_0,
             (tvec3<float,_(glm::precision)0> *)&local_5c.field_0,in_R8);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::
view_matrix () const
{
	return glm::lookAt (from(), to(), up());
}